

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O0

DataType __thiscall draco::PlyReader::GetDataTypeFromString(PlyReader *this,string *name)

{
  bool bVar1;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  bVar1 = std::operator==(in_RDI,in_RSI);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_RSI), bVar1)) {
    return DT_INT8;
  }
  bVar1 = std::operator==(in_RDI,in_RSI);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_RSI), bVar1)) {
    return DT_UINT8;
  }
  bVar1 = std::operator==(in_RDI,in_RSI);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_RSI), bVar1)) {
    return DT_INT16;
  }
  bVar1 = std::operator==(in_RDI,in_RSI);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_RSI), bVar1)) {
    return DT_UINT16;
  }
  bVar1 = std::operator==(in_RDI,in_RSI);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_RSI), bVar1)) {
    return DT_INT32;
  }
  bVar1 = std::operator==(in_RDI,in_RSI);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_RSI), bVar1)) {
    return DT_UINT32;
  }
  bVar1 = std::operator==(in_RDI,in_RSI);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_RSI), bVar1)) {
    return DT_FLOAT32;
  }
  bVar1 = std::operator==(in_RDI,in_RSI);
  if ((!bVar1) && (bVar1 = std::operator==(in_RDI,in_RSI), !bVar1)) {
    return DT_INVALID;
  }
  return DT_FLOAT64;
}

Assistant:

DataType PlyReader::GetDataTypeFromString(const std::string &name) const {
  if (name == "char" || name == "int8") {
    return DT_INT8;
  }
  if (name == "uchar" || name == "uint8") {
    return DT_UINT8;
  }
  if (name == "short" || name == "int16") {
    return DT_INT16;
  }
  if (name == "ushort" || name == "uint16") {
    return DT_UINT16;
  }
  if (name == "int" || name == "int32") {
    return DT_INT32;
  }
  if (name == "uint" || name == "uint32") {
    return DT_UINT32;
  }
  if (name == "float" || name == "float32") {
    return DT_FLOAT32;
  }
  if (name == "double" || name == "float64") {
    return DT_FLOAT64;
  }
  return DT_INVALID;
}